

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

void __thiscall
sf::Texture::update(Texture *this,Uint8 *pixels,uint width,uint height,uint x,uint y)

{
  Uint64 UVar1;
  TextureSaver local_30;
  TransientContextLock local_29;
  TextureSaver save;
  TransientContextLock lock;
  uint y_local;
  uint x_local;
  uint height_local;
  uint width_local;
  Uint8 *pixels_local;
  Texture *this_local;
  
  save.m_textureBinding = y;
  if ((this->m_size).x < x + width) {
    __assert_fail("x + width <= m_size.x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                  ,0x19d,
                  "void sf::Texture::update(const Uint8 *, unsigned int, unsigned int, unsigned int, unsigned int)"
                 );
  }
  if (y + height <= (this->m_size).y) {
    if ((pixels != (Uint8 *)0x0) && (this->m_texture != 0)) {
      GlResource::TransientContextLock::TransientContextLock(&local_29);
      priv::TextureSaver::TextureSaver(&local_30);
      glBindTexture(0xde1,this->m_texture);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x1a8,"glBindTexture(GL_TEXTURE_2D, m_texture)");
      glTexSubImage2D(0xde1,0,x,save.m_textureBinding,width,height,0x1908,0x1401,pixels);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x1a9,
                         "glTexSubImage2D(GL_TEXTURE_2D, 0, x, y, width, height, GL_RGBA, GL_UNSIGNED_BYTE, pixels)"
                        );
      glTexParameteri(0xde1,0x2801,this->m_isSmooth & 1 | 0x2600);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x1aa,
                         "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST)"
                        );
      this->m_hasMipmap = false;
      this->m_pixelsFlipped = false;
      UVar1 = anon_unknown.dwarf_d70e4::getUniqueId();
      this->m_cacheId = UVar1;
      glFlush();
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x1b1,"glFlush()");
      priv::TextureSaver::~TextureSaver(&local_30);
      GlResource::TransientContextLock::~TransientContextLock(&local_29);
    }
    return;
  }
  __assert_fail("y + height <= m_size.y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                ,0x19e,
                "void sf::Texture::update(const Uint8 *, unsigned int, unsigned int, unsigned int, unsigned int)"
               );
}

Assistant:

void Texture::update(const Uint8* pixels, unsigned int width, unsigned int height, unsigned int x, unsigned int y)
{
    assert(x + width <= m_size.x);
    assert(y + height <= m_size.y);

    if (pixels && m_texture)
    {
        TransientContextLock lock;

        // Make sure that the current texture binding will be preserved
        priv::TextureSaver save;

        // Copy pixels from the given array to the texture
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glTexSubImage2D(GL_TEXTURE_2D, 0, x, y, width, height, GL_RGBA, GL_UNSIGNED_BYTE, pixels));
        glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
        m_hasMipmap = false;
        m_pixelsFlipped = false;
        m_cacheId = getUniqueId();

        // Force an OpenGL flush, so that the texture data will appear updated
        // in all contexts immediately (solves problems in multi-threaded apps)
        glCheck(glFlush());
    }
}